

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O3

pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_> *
__thiscall
miniros::master::RegistrationManager::registerNodeApi
          (pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_>
           *__return_storage_ptr__,RegistrationManager *this,string *caller_id,string *caller_api)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
  *this_00;
  _Alloc_hider _Var1;
  int iVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  NodeRef *this_01;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  bool bVar8;
  shared_ptr<miniros::master::NodeRef> node_ref;
  string local_a8;
  long *local_88 [2];
  long local_78 [2];
  NodeRefPtr prevNode;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_guard);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->m_nodes;
  cVar3 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
          ::find(&this_00->_M_t,caller_id);
  if ((_Rb_tree_header *)cVar3._M_node != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header) {
    pmVar4 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
             ::operator[](this_00,caller_id);
    node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pmVar4->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(pmVar4->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
  }
  prevNode.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  prevNode.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    NodeRef::getApi_abi_cxx11_
              (&local_a8,
               node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    _Var1._M_p = local_a8._M_dataplus._M_p;
    if (local_a8._M_string_length == caller_api->_M_string_length) {
      if (local_a8._M_string_length == 0) {
        bVar8 = true;
      }
      else {
        iVar2 = bcmp(local_a8._M_dataplus._M_p,(caller_api->_M_dataplus)._M_p,
                     local_a8._M_string_length);
        bVar8 = iVar2 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var1._M_p != &local_a8.field_2) {
      operator_delete(_Var1._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (bVar8) goto LAB_0023b877;
    prevNode.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&prevNode.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (registerNodeApi::loc.initialized_ == false) {
      local_88[0] = local_78;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_88,"miniros.unknown_package","");
      plVar5 = (long *)::std::__cxx11::string::append((char *)local_88);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_40 = *plVar6;
        lStack_38 = plVar5[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar6;
        local_50 = (long *)*plVar5;
      }
      local_48 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_50);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_a8.field_2._M_allocated_capacity = *psVar7;
        local_a8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_a8.field_2._M_allocated_capacity = *psVar7;
        local_a8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_a8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      console::initializeLogLocation(&registerNodeApi::loc,&local_a8,Warn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
    }
    if (registerNodeApi::loc.level_ != Warn) {
      console::setLogLocationLevel(&registerNodeApi::loc,Warn);
      console::checkLogLocationEnabled(&registerNodeApi::loc);
    }
    if (registerNodeApi::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,registerNodeApi::loc.logger_,registerNodeApi::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/registration_manager.cpp"
                     ,0xa5,
                     "std::pair<NodeRefPtr, NodeRefPtr> miniros::master::RegistrationManager::registerNodeApi(const std::string &, const std::string &)"
                     ,"New node registered with name=\"%s\" api=%s",(caller_id->_M_dataplus)._M_p,
                     (caller_api->_M_dataplus)._M_p);
    }
    ::std::
    _Rb_tree<std::shared_ptr<miniros::master::NodeRef>,std::shared_ptr<miniros::master::NodeRef>,std::_Identity<std::shared_ptr<miniros::master::NodeRef>>,std::less<std::shared_ptr<miniros::master::NodeRef>>,std::allocator<std::shared_ptr<miniros::master::NodeRef>>>
    ::_M_insert_unique<std::shared_ptr<miniros::master::NodeRef>const&>
              ((_Rb_tree<std::shared_ptr<miniros::master::NodeRef>,std::shared_ptr<miniros::master::NodeRef>,std::_Identity<std::shared_ptr<miniros::master::NodeRef>>,std::less<std::shared_ptr<miniros::master::NodeRef>>,std::allocator<std::shared_ptr<miniros::master::NodeRef>>>
                *)&this->m_nodesToShutdown,&node_ref);
  }
  this_01 = (NodeRef *)operator_new(0x1b8);
  NodeRef::NodeRef(this_01,caller_id,caller_api);
  ::std::__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>::
  reset<miniros::master::NodeRef>
            (&node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>,
             this_01);
  pmVar4 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
           ::operator[](this_00,caller_id);
  (pmVar4->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar4->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,
             &node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_0023b877:
  ::std::pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_>
  ::
  pair<std::shared_ptr<miniros::master::NodeRef>_&,_std::shared_ptr<miniros::master::NodeRef>_&,_true>
            (__return_storage_ptr__,&node_ref,&prevNode);
  if (prevNode.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (prevNode.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_guard);
  return __return_storage_ptr__;
}

Assistant:

std::pair<NodeRefPtr, NodeRefPtr> RegistrationManager::registerNodeApi(const std::string& caller_id, const std::string& caller_api)
{
  std::scoped_lock<std::mutex> lock(m_guard);

  std::shared_ptr<NodeRef> node_ref;
  if (m_nodes.count(caller_id))
    node_ref = m_nodes[caller_id];

  NodeRefPtr prevNode;
  if (node_ref) {
    if (node_ref->getApi() == caller_api) {
      return {node_ref, prevNode};
    } else {
      prevNode = node_ref;
      MINIROS_WARN_NAMED("reg", "New node registered with name=\"%s\" api=%s", caller_id.c_str(), caller_api.c_str());
      m_nodesToShutdown.insert(node_ref);
    }
  }

  node_ref.reset(new NodeRef(caller_id, caller_api));
  m_nodes[caller_id] = node_ref;

  return {node_ref, prevNode};
}